

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O2

NodeRefPtr<4> __thiscall
embree::sse2::GeneralBVHBuilder::
BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::sse2::CreateLeafSpatial<4,_embree::TriangleMi<4>_>_>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::sse2::CreateLeafSpatial<4,_embree::TriangleMi<4>_>_>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
                  *this,BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
                        *current,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  char *pcVar2;
  ThreadLocal2 *this_00;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  size_t i_1;
  long lVar8;
  Vec3fa *pVVar9;
  NodeRefPtr<4> NVar10;
  size_t sVar11;
  undefined8 *puVar12;
  ulong uVar13;
  unsigned_long *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  size_t i_2;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  *this_01;
  char *pcVar19;
  bool bVar20;
  ulong local_838;
  ThreadLocal2 *local_830;
  NodeRefPtr<4> values [16];
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  local_7a8;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  children [16];
  
  if ((this->cfg).maxDepth < current->depth) {
    puVar12 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)children,"depth limit reached",(allocator *)values);
    *puVar12 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar12 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar12 + 2),(string *)children);
    __cxa_throw(puVar12,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  if ((current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin <=
      (this->cfg).maxLeafSize) {
    NVar10 = BVHBuilderBinnedFastSpatialSAH::
             CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMi<4>>>
             ::operator()((CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMi<4>>>
                           *)this->createLeaf,this->prims,
                          &(current->prims).super_extended_range<unsigned_long>.
                           super_range<unsigned_long>,alloc);
    return (NodeRefPtr<4>)NVar10.ptr;
  }
  this_01 = children;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  ::operator=(this_01,current);
  uVar18 = 1;
  do {
    puVar14 = &children[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end
    ;
    uVar13 = 0xffffffffffffffff;
    uVar15 = 0;
    for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
      uVar17 = *puVar14 - ((range<unsigned_long> *)(puVar14 + -1))->_begin;
      if (((this->cfg).maxLeafSize < uVar17) && (uVar15 < uVar17)) {
        uVar13 = uVar16;
        uVar15 = uVar17;
      }
      puVar14 = puVar14 + 0xe;
    }
    if (uVar13 == 0xffffffffffffffff) break;
    values[0].ptr = current->depth + 1;
    values[1].ptr._0_1_ = 0;
    values[2].ptr = 0x7f8000007f800000;
    values[3].ptr = 0x7f8000007f800000;
    values[4].ptr = 0xff800000ff800000;
    values[5].ptr = 0xff800000ff800000;
    values[6].ptr = 0x7f8000007f800000;
    values[7].ptr = 0x7f8000007f800000;
    values[8].ptr = 0xff800000ff800000;
    values[9].ptr = 0xff800000ff800000;
    values[0xc].ptr = 0;
    values[10].ptr = 0;
    values[0xb].ptr = 0;
    local_7a8.alloc_barrier = false;
    local_7a8.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ = 0x7f8000007f800000;
    local_7a8.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._8_8_ = 0x7f8000007f800000;
    local_7a8.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._0_8_ = 0xff800000ff800000;
    local_7a8.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._8_8_ = 0xff800000ff800000;
    local_7a8.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._0_8_ = 0x7f8000007f800000;
    local_7a8.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._8_8_ = 0x7f8000007f800000;
    local_7a8.prims.super_CentGeomBBox3fa.centBounds.upper.field_0._0_8_ = 0xff800000ff800000;
    local_7a8.prims.super_CentGeomBBox3fa.centBounds.upper.field_0._8_8_ = 0xff800000ff800000;
    local_7a8.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin = 0;
    local_7a8.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end = 0;
    local_7a8.prims.super_extended_range<unsigned_long>._ext_end = 0;
    local_7a8.depth = values[0].ptr;
    HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
    splitFallback(this->heuristic,&children[uVar13].prims,(PrimInfoExtRange *)(values + 2),
                  &local_7a8.prims);
    BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
    ::operator=(children + uVar13,&local_7a8 + uVar18);
    BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
    ::operator=(&local_7a8 + uVar18,
                (BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
                 *)values);
    BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
    ::operator=(children + uVar18,&local_7a8);
    uVar18 = uVar18 + 1;
  } while (uVar18 < (this->cfg).branchingFactor);
  uVar13 = (this->cfg).primrefarrayalloc;
  if (uVar13 < (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end
               - (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>.
                 _begin) {
    puVar14 = &children[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end
    ;
    uVar15 = uVar18;
    while (bVar20 = uVar15 != 0, uVar15 = uVar15 - 1, bVar20) {
      *(bool *)(puVar14 + -10) =
           *puVar14 - ((range<unsigned_long> *)(puVar14 + -1))->_begin <= uVar13;
      puVar14 = puVar14 + 0xe;
    }
  }
  local_838 = 0x80;
  this_00 = (alloc.talloc0)->parent;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    local_7a8.alloc_barrier = true;
    local_7a8.depth = (size_t)this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    values[0].ptr = (size_t)&FastAllocator::s_thread_local_allocators_lock;
    values[1].ptr._0_1_ = 1;
    local_830 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,&local_830);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)values);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_7a8);
  }
  uVar13 = local_838;
  (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + local_838;
  sVar11 = (alloc.talloc0)->cur;
  uVar15 = (ulong)(-(int)sVar11 & 0xf);
  uVar16 = sVar11 + local_838 + uVar15;
  (alloc.talloc0)->cur = uVar16;
  if ((alloc.talloc0)->end < uVar16) {
    (alloc.talloc0)->cur = sVar11;
    uVar15 = (alloc.talloc0)->allocBlockSize;
    if (local_838 * 4 < uVar15 || local_838 * 4 - uVar15 == 0) {
      values[0].ptr = uVar15;
      pcVar19 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)values);
      (alloc.talloc0)->ptr = pcVar19;
      sVar11 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar11;
      (alloc.talloc0)->end = values[0].ptr;
      (alloc.talloc0)->cur = uVar13;
      if (values[0].ptr < uVar13) {
        (alloc.talloc0)->cur = 0;
        values[0].ptr = (alloc.talloc0)->allocBlockSize;
        pcVar19 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)values);
        (alloc.talloc0)->ptr = pcVar19;
        sVar11 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar11;
        (alloc.talloc0)->end = values[0].ptr;
        (alloc.talloc0)->cur = uVar13;
        if (values[0].ptr < uVar13) {
          (alloc.talloc0)->cur = 0;
          pcVar19 = (char *)0x0;
          goto LAB_00497bb0;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar11;
    }
    else {
      pcVar19 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_838);
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar15;
    pcVar19 = (alloc.talloc0)->ptr + (uVar16 - local_838);
  }
LAB_00497bb0:
  pcVar19[0x60] = '\0';
  pcVar19[0x61] = '\0';
  pcVar19[0x62] = -0x80;
  pcVar19[99] = '\x7f';
  pcVar19[100] = '\0';
  pcVar19[0x65] = '\0';
  pcVar19[0x66] = -0x80;
  pcVar19[0x67] = '\x7f';
  pcVar19[0x68] = '\0';
  pcVar19[0x69] = '\0';
  pcVar19[0x6a] = -0x80;
  pcVar19[0x6b] = '\x7f';
  pcVar19[0x6c] = '\0';
  pcVar19[0x6d] = '\0';
  pcVar19[0x6e] = -0x80;
  pcVar19[0x6f] = '\x7f';
  pcVar19[0x40] = '\0';
  pcVar19[0x41] = '\0';
  pcVar19[0x42] = -0x80;
  pcVar19[0x43] = '\x7f';
  pcVar19[0x44] = '\0';
  pcVar19[0x45] = '\0';
  pcVar19[0x46] = -0x80;
  pcVar19[0x47] = '\x7f';
  pcVar19[0x48] = '\0';
  pcVar19[0x49] = '\0';
  pcVar19[0x4a] = -0x80;
  pcVar19[0x4b] = '\x7f';
  pcVar19[0x4c] = '\0';
  pcVar19[0x4d] = '\0';
  pcVar19[0x4e] = -0x80;
  pcVar19[0x4f] = '\x7f';
  pcVar19[0x20] = '\0';
  pcVar19[0x21] = '\0';
  pcVar19[0x22] = -0x80;
  pcVar19[0x23] = '\x7f';
  pcVar19[0x24] = '\0';
  pcVar19[0x25] = '\0';
  pcVar19[0x26] = -0x80;
  pcVar19[0x27] = '\x7f';
  pcVar19[0x28] = '\0';
  pcVar19[0x29] = '\0';
  pcVar19[0x2a] = -0x80;
  pcVar19[0x2b] = '\x7f';
  pcVar19[0x2c] = '\0';
  pcVar19[0x2d] = '\0';
  pcVar19[0x2e] = -0x80;
  pcVar19[0x2f] = '\x7f';
  pcVar19[0x70] = '\0';
  pcVar19[0x71] = '\0';
  pcVar19[0x72] = -0x80;
  pcVar19[0x73] = -1;
  pcVar19[0x74] = '\0';
  pcVar19[0x75] = '\0';
  pcVar19[0x76] = -0x80;
  pcVar19[0x77] = -1;
  pcVar19[0x78] = '\0';
  pcVar19[0x79] = '\0';
  pcVar19[0x7a] = -0x80;
  pcVar19[0x7b] = -1;
  pcVar19[0x7c] = '\0';
  pcVar19[0x7d] = '\0';
  pcVar19[0x7e] = -0x80;
  pcVar19[0x7f] = -1;
  pcVar19[0x50] = '\0';
  pcVar19[0x51] = '\0';
  pcVar19[0x52] = -0x80;
  pcVar19[0x53] = -1;
  pcVar19[0x54] = '\0';
  pcVar19[0x55] = '\0';
  pcVar19[0x56] = -0x80;
  pcVar19[0x57] = -1;
  pcVar19[0x58] = '\0';
  pcVar19[0x59] = '\0';
  pcVar19[0x5a] = -0x80;
  pcVar19[0x5b] = -1;
  pcVar19[0x5c] = '\0';
  pcVar19[0x5d] = '\0';
  pcVar19[0x5e] = -0x80;
  pcVar19[0x5f] = -1;
  pcVar19[0x30] = '\0';
  pcVar19[0x31] = '\0';
  pcVar19[0x32] = -0x80;
  pcVar19[0x33] = -1;
  pcVar19[0x34] = '\0';
  pcVar19[0x35] = '\0';
  pcVar19[0x36] = -0x80;
  pcVar19[0x37] = -1;
  pcVar19[0x38] = '\0';
  pcVar19[0x39] = '\0';
  pcVar19[0x3a] = -0x80;
  pcVar19[0x3b] = -1;
  pcVar19[0x3c] = '\0';
  pcVar19[0x3d] = '\0';
  pcVar19[0x3e] = -0x80;
  pcVar19[0x3f] = -1;
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    pcVar2 = pcVar19 + lVar8 * 8;
    pcVar2[0] = '\b';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
  }
  pVVar9 = &children[0].prims.super_CentGeomBBox3fa.geomBounds.upper;
  for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
    fVar3 = (((BBox<embree::Vec3fa> *)(pVVar9 + -1))->lower).field_0.m128[1];
    fVar4 = (((BBox<embree::Vec3fa> *)(pVVar9 + -1))->lower).field_0.m128[2];
    fVar5 = (pVVar9->field_0).m128[0];
    fVar6 = (pVVar9->field_0).m128[1];
    fVar7 = (pVVar9->field_0).m128[2];
    *(float *)(pcVar19 + uVar13 * 4 + 0x20) =
         (((BBox<embree::Vec3fa> *)(pVVar9 + -1))->lower).field_0.m128[0];
    *(float *)(pcVar19 + uVar13 * 4 + 0x40) = fVar3;
    *(float *)(pcVar19 + uVar13 * 4 + 0x60) = fVar4;
    *(float *)(pcVar19 + uVar13 * 4 + 0x30) = fVar5;
    *(float *)(pcVar19 + uVar13 * 4 + 0x50) = fVar6;
    *(float *)(pcVar19 + uVar13 * 4 + 0x70) = fVar7;
    pVVar9 = pVVar9 + 7;
  }
  for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
    NVar10 = createLargeLeaf(this,this_01,alloc);
    values[uVar13].ptr = NVar10.ptr;
    this_01 = this_01 + 1;
  }
  for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
    *(size_t *)(pcVar19 + uVar13 * 8) = values[uVar13].ptr;
  }
  return (NodeRefPtr<4>)(size_t)pcVar19;
}

Assistant:

const ReductionTy createLargeLeaf(const BuildRecord& current, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (current.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* create leaf for few primitives */
            if (current.prims.size() <= cfg.maxLeafSize && canCreateLeaf(prims,current.prims))
              return createLeaf(prims,current.prims,alloc);

            /* fill all children by always splitting the largest one */
            ReductionTy values[MAX_BRANCHING_FACTOR];
            BuildRecord children[MAX_BRANCHING_FACTOR];
            size_t numChildren = 1;
            children[0] = current;
            do {

              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<numChildren; i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].prims.size() <= cfg.maxLeafSize && canCreateLeaf(prims,children[i].prims))
                  continue;

                /* remember child with largest size */
                if (children[i].prims.size() > bestSize) {
                  bestSize = children[i].prims.size();
                  bestChild = i;
                }
              }
              if (bestChild == (size_t)-1) break;

              /*! split best child into left and right child */
              BuildRecord left(current.depth+1);
              BuildRecord right(current.depth+1);
              if (!canCreateLeaf(prims,children[bestChild].prims)) {
                canCreateLeafSplit(prims,children[bestChild].prims,left.prims,right.prims);
              } else {
                heuristic.splitFallback(children[bestChild].prims,left.prims,right.prims);
              }

              /* add new children left and right */
              children[bestChild] = children[numChildren-1];
              children[numChildren-1] = left;
              children[numChildren+0] = right;
              numChildren++;

            } while (numChildren < cfg.branchingFactor);

            /* set barrier for primrefarrayalloc */
            if (unlikely(current.size() > cfg.primrefarrayalloc))
              for (size_t i=0; i<numChildren; i++)
                children[i].alloc_barrier = children[i].size() <= cfg.primrefarrayalloc;

            /* create node */
            auto node = createNode(children,numChildren,alloc);

            /* recurse into each child  and perform reduction */
            for (size_t i=0; i<numChildren; i++)
              values[i] = createLargeLeaf(children[i],alloc);

            /* perform reduction */
            return updateNode(current,children,node,values,numChildren);
          }